

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-ws.c
# Opt level: O0

int rops_write_role_protocol_ws(lws *wsi,uchar *buf,size_t len,lws_write_protocol *wp)

{
  byte bVar1;
  _lws_websocket_related *p_Var2;
  uchar uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  lws_write_protocol *plVar7;
  lws *plVar8;
  bool bVar9;
  lws *encap;
  int n;
  int pre;
  size_t orig_len;
  uchar *dropmask;
  uchar is_masked_bit;
  int masked7;
  lws_ext_pm_deflate_rx_ebufs pmdrx;
  lws_write_protocol *wp_local;
  size_t len_local;
  uchar *buf_local;
  lws *wsi_local;
  
  bVar9 = (wsi->wsistate & 0x10000000) != 0;
  dropmask._3_1_ = 0;
  orig_len = 0;
  encap._4_4_ = 0;
  wp_local = (lws_write_protocol *)len;
  if (((((*wp & 0x1f) != LWS_WRITE_HTTP) && ((*wp & 0x1f) != LWS_WRITE_HTTP_FINAL)) &&
      ((*wp & 0x1f) != LWS_WRITE_HTTP_HEADERS_CONTINUATION)) &&
     ((*wp & 0x1f) != LWS_WRITE_HTTP_HEADERS)) {
    wp_local._0_4_ = (int)len;
    iVar6 = (int)wp_local;
    if ((*(ushort *)&wsi->ws->field_0x95 >> 4 & 1) == 0) {
      *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 | 0x20;
      if (((2 < *wp + ~LWS_WRITE_HTTP) && ((int)wp_local != 0)) &&
         ((*(ushort *)&wsi->ws->field_0x95 >> 0xc & 1) != 0)) {
        *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xefff;
        *wp = *wp & (LWS_WRITE_CLIENT_IGNORE_XOR_MASK|LWS_WRITE_NO_FIN) |
              (uint)wsi->ws->stashed_write_type;
      }
      plVar7 = (lws_write_protocol *)(long)(int)wp_local;
      if (buf == (uchar *)0x0) {
        _lws_log(1,"null buf (%d)\n",len & 0xffffffff);
        return -1;
      }
      if (wsi->ws->ietf_spec_revision == '\r') {
        if (bVar9) {
          encap._4_4_ = 4;
          orig_len = (size_t)(buf + -4);
          dropmask._3_1_ = 0x80;
        }
        switch(*wp & (LWS_WRITE_HTTP_HEADERS|LWS_WRITE_HTTP_FINAL)) {
        case LWS_WRITE_TEXT:
          bVar4 = 1;
          break;
        case LWS_WRITE_BINARY:
          bVar4 = 2;
          break;
        case LWS_WRITE_CONTINUATION:
          bVar4 = 0;
          break;
        default:
          _lws_log(2,"lws_write: unknown write opc / wp\n");
          return -1;
        case 4:
          bVar4 = 8;
          break;
        case LWS_WRITE_PING:
          bVar4 = 9;
          break;
        case LWS_WRITE_PONG:
          bVar4 = 10;
        }
        if ((*wp & LWS_WRITE_NO_FIN) == LWS_WRITE_TEXT) {
          bVar4 = bVar4 | 0x80;
        }
        bVar1 = (byte)len;
        if (plVar7 < (lws_write_protocol *)0x7e) {
          encap._4_4_ = encap._4_4_ + 2;
          buf[-encap._4_4_] = bVar4;
          buf[1 - encap._4_4_] = bVar1 | dropmask._3_1_;
        }
        else {
          uVar3 = (uchar)(len >> 8);
          if (plVar7 < (lws_write_protocol *)0x10000) {
            encap._4_4_ = encap._4_4_ + 4;
            buf[-encap._4_4_] = bVar4;
            buf[1 - encap._4_4_] = dropmask._3_1_ | 0x7e;
            buf[2 - encap._4_4_] = uVar3;
            buf[3 - encap._4_4_] = bVar1;
          }
          else {
            encap._4_4_ = encap._4_4_ + 10;
            buf[-encap._4_4_] = bVar4;
            buf[1 - encap._4_4_] = dropmask._3_1_ | 0x7f;
            bVar4 = (byte)((int)wp_local >> 0x1f);
            buf[2 - encap._4_4_] = bVar4 & 0x7f;
            buf[3 - encap._4_4_] = bVar4;
            buf[4 - encap._4_4_] = bVar4;
            buf[5 - encap._4_4_] = bVar4;
            buf[6 - encap._4_4_] = (uchar)(len >> 0x18);
            buf[7 - encap._4_4_] = (uchar)(len >> 0x10);
            buf[8 - encap._4_4_] = uVar3;
            buf[9 - encap._4_4_] = bVar1;
          }
        }
      }
    }
    else {
      _lws_log(0x10,"INSIDE FRAME\n");
      plVar7 = (lws_write_protocol *)len;
    }
    wp_local = plVar7;
    if (bVar9) {
      if (((*(ushort *)&wsi->ws->field_0x95 >> 4 & 1) == 0) &&
         (iVar5 = lws_0405_frame_mask_generate(wsi), iVar5 != 0)) {
        _lws_log(1,"frame mask generation failed\n");
        return -1;
      }
      if (orig_len != 0) {
        for (encap._0_4_ = 4; (int)encap < (int)wp_local + 4; encap._0_4_ = (int)encap + 1) {
          bVar4 = *(byte *)(orig_len + (long)(int)encap);
          p_Var2 = wsi->ws;
          bVar1 = wsi->ws->mask_idx;
          wsi->ws->mask_idx = bVar1 + 1;
          *(byte *)(orig_len + (long)(int)encap) = bVar4 ^ p_Var2->mask[(int)(bVar1 & 3)];
        }
        *(undefined4 *)orig_len = *(undefined4 *)wsi->ws->mask;
      }
    }
    if ((wsi->wsistate & 0xf000000) == 0x1000000) {
      plVar8 = lws_get_network_wsi(wsi);
      if (plVar8 != wsi) {
        iVar6 = (*plVar8->role_ops->write_role_protocol)
                          (wsi,buf + -(long)encap._4_4_,(long)wp_local + (long)encap._4_4_,wp);
        return iVar6;
      }
      __assert_fail("encap != wsi",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/ws/ops-ws.c"
                    ,0x72d,
                    "int rops_write_role_protocol_ws(struct lws *, unsigned char *, size_t, enum lws_write_protocol *)"
                   );
    }
    if (((*wp & 0x1f) < LWS_WRITE_HTTP) && ((*(ulong *)&wsi->field_0x2dc >> 4 & 1) == 0)) {
      iVar5 = lws_issue_raw(wsi,buf + -(long)encap._4_4_,(long)wp_local + (long)encap._4_4_);
      *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xffef | 0x10;
      if (iVar5 < 1) {
        return iVar5;
      }
      if (iVar5 == (int)wp_local + encap._4_4_) {
        *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xffef;
        return iVar6;
      }
      return iVar5 - encap._4_4_;
    }
  }
  iVar6 = lws_issue_raw(wsi,buf + -(long)encap._4_4_,(long)wp_local + (long)encap._4_4_);
  return iVar6;
}

Assistant:

static int
rops_write_role_protocol_ws(struct lws *wsi, unsigned char *buf, size_t len,
			    enum lws_write_protocol *wp)
{
#if !defined(LWS_WITHOUT_EXTENSIONS)
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	enum lws_write_protocol wpt;
#endif
	struct lws_ext_pm_deflate_rx_ebufs pmdrx;
	int masked7 = lwsi_role_client(wsi);
	unsigned char is_masked_bit = 0;
	unsigned char *dropmask = NULL;
	size_t orig_len = len;
	int pre = 0, n = 0;

	// lwsl_err("%s: wp 0x%x len %d\n", __func__, *wp, (int)len);
#if !defined(LWS_WITHOUT_EXTENSIONS)
	if (wsi->ws->tx_draining_ext) {
		/* remove us from the list */
		struct lws **w = &pt->ws.tx_draining_ext_list;

		lwsl_ext("%s: CLEARING tx_draining_ext\n", __func__);
		wsi->ws->tx_draining_ext = 0;
		/* remove us from context draining ext list */
		while (*w) {
			if (*w == wsi) {
				*w = wsi->ws->tx_draining_ext_list;
				break;
			}
			w = &((*w)->ws->tx_draining_ext_list);
		}
		wsi->ws->tx_draining_ext_list = NULL;

		wpt = *wp;
		*wp = (wsi->ws->tx_draining_stashed_wp & 0xc0) |
				LWS_WRITE_CONTINUATION;

		/*
		 * When we are just flushing (len == 0), we can trust the
		 * stashed wp info completely.  Otherwise adjust it to the
		 * FIN status of the incoming packet.
		 */

		if (!(wpt & LWS_WRITE_NO_FIN) && len)
			*wp &= ~LWS_WRITE_NO_FIN;

		lwsl_ext("FORCED draining wp to 0x%02X "
			 "(stashed 0x%02X, incoming 0x%02X)\n", *wp,
			 wsi->ws->tx_draining_stashed_wp, wpt);
		// assert(0);
	}
#endif

	if (((*wp) & 0x1f) == LWS_WRITE_HTTP ||
	    ((*wp) & 0x1f) == LWS_WRITE_HTTP_FINAL ||
	    ((*wp) & 0x1f) == LWS_WRITE_HTTP_HEADERS_CONTINUATION ||
	    ((*wp) & 0x1f) == LWS_WRITE_HTTP_HEADERS)
		goto send_raw;



	/* if we are continuing a frame that already had its header done */

	if (wsi->ws->inside_frame) {
		lwsl_debug("INSIDE FRAME\n");
		goto do_more_inside_frame;
	}

	wsi->ws->clean_buffer = 1;

	/*
	 * give a chance to the extensions to modify payload
	 * the extension may decide to produce unlimited payload erratically
	 * (eg, compression extension), so we require only that if he produces
	 * something, it will be a complete fragment of the length known at
	 * the time (just the fragment length known), and if he has
	 * more we will come back next time he is writeable and allow him to
	 * produce more fragments until he's drained.
	 *
	 * This allows what is sent each time it is writeable to be limited to
	 * a size that can be sent without partial sends or blocking, allows
	 * interleaving of control frames and other connection service.
	 */

	pmdrx.eb_in.token = buf;
	pmdrx.eb_in.len = (int)len;

	/* for the non-pm-deflate case */

	pmdrx.eb_out = pmdrx.eb_in;

	switch ((int)*wp) {
	case LWS_WRITE_PING:
	case LWS_WRITE_PONG:
	case LWS_WRITE_CLOSE:
		break;
	default:
#if !defined(LWS_WITHOUT_EXTENSIONS)
		n = lws_ext_cb_active(wsi, LWS_EXT_CB_PAYLOAD_TX, &pmdrx, *wp);
		if (n < 0)
			return -1;
		lwsl_ext("%s: defl ext ret %d, ext in remaining %d, "
			    "out %d compressed (wp 0x%x)\n", __func__, n,
			    (int)pmdrx.eb_in.len, (int)pmdrx.eb_out.len, *wp);

		if (n == PMDR_HAS_PENDING) {
			lwsl_ext("%s: HAS PENDING: write drain len %d "
				    "(wp 0x%x) SETTING tx_draining_ext "
				    "(remaining in %d)\n", __func__,
				    (int)pmdrx.eb_out.len, *wp,
				    (int)pmdrx.eb_in.len);
			/* extension requires further draining */
			wsi->ws->tx_draining_ext = 1;
			wsi->ws->tx_draining_ext_list =
					pt->ws.tx_draining_ext_list;
			pt->ws.tx_draining_ext_list = wsi;
			/* we must come back to do more */
			lws_callback_on_writable(wsi);
			/*
			 * keep a copy of the write type for the overall
			 * action that has provoked generation of these
			 * fragments, so the last guy can use its FIN state.
			 */
			wsi->ws->tx_draining_stashed_wp = *wp;
			/*
			 * Despite what we may have thought, this is definitely
			 * NOT the last fragment, because the extension asserted
			 * he has more coming.  For example, the extension may
			 * be compressing, and has saved up everything until the
			 * end, where the output is larger than one chunk.
			 *
			 * Make sure this intermediate one doesn't actually
			 * go out with a FIN.
			 */
			*wp |= LWS_WRITE_NO_FIN;
		}
#endif
		if (pmdrx.eb_out.len && wsi->ws->stashed_write_pending) {
			wsi->ws->stashed_write_pending = 0;
			*wp = ((*wp) & 0xc0) | (int)wsi->ws->stashed_write_type;
		}
	}

	/*
	 * an extension did something we need to keep... for example, if
	 * compression extension, it has already updated its state according
	 * to this being issued
	 */
	if (buf != pmdrx.eb_out.token) {
		/*
		 * ext might eat it, but not have anything to issue yet.
		 * In that case we have to follow his lead, but stash and
		 * replace the write type that was lost here the first time.
		 */
		if (len && !pmdrx.eb_out.len) {
			if (!wsi->ws->stashed_write_pending)
				wsi->ws->stashed_write_type =
						(char)(*wp) & 0x3f;
			wsi->ws->stashed_write_pending = 1;
			return (int)len;
		}
		/*
		 * extension recreated it:
		 * need to buffer this if not all sent
		 */
		wsi->ws->clean_buffer = 0;
	}

	buf = pmdrx.eb_out.token;
	len = pmdrx.eb_out.len;

	if (!buf) {
		lwsl_err("null buf (%d)\n", (int)len);
		return -1;
	}

	switch (wsi->ws->ietf_spec_revision) {
	case 13:
		if (masked7) {
			pre += 4;
			dropmask = &buf[0 - pre];
			is_masked_bit = 0x80;
		}

		switch ((*wp) & 0xf) {
		case LWS_WRITE_TEXT:
			n = LWSWSOPC_TEXT_FRAME;
			break;
		case LWS_WRITE_BINARY:
			n = LWSWSOPC_BINARY_FRAME;
			break;
		case LWS_WRITE_CONTINUATION:
			n = LWSWSOPC_CONTINUATION;
			break;

		case LWS_WRITE_CLOSE:
			n = LWSWSOPC_CLOSE;
			break;
		case LWS_WRITE_PING:
			n = LWSWSOPC_PING;
			break;
		case LWS_WRITE_PONG:
			n = LWSWSOPC_PONG;
			break;
		default:
			lwsl_warn("lws_write: unknown write opc / wp\n");
			return -1;
		}

		if (!((*wp) & LWS_WRITE_NO_FIN))
			n |= 1 << 7;

		if (len < 126) {
			pre += 2;
			buf[-pre] = n;
			buf[-pre + 1] = (unsigned char)(len | is_masked_bit);
		} else {
			if (len < 65536) {
				pre += 4;
				buf[-pre] = n;
				buf[-pre + 1] = 126 | is_masked_bit;
				buf[-pre + 2] = (unsigned char)(len >> 8);
				buf[-pre + 3] = (unsigned char)len;
			} else {
				pre += 10;
				buf[-pre] = n;
				buf[-pre + 1] = 127 | is_masked_bit;
#if defined __LP64__
					buf[-pre + 2] = (len >> 56) & 0x7f;
					buf[-pre + 3] = len >> 48;
					buf[-pre + 4] = len >> 40;
					buf[-pre + 5] = len >> 32;
#else
					buf[-pre + 2] = 0;
					buf[-pre + 3] = 0;
					buf[-pre + 4] = 0;
					buf[-pre + 5] = 0;
#endif
				buf[-pre + 6] = (unsigned char)(len >> 24);
				buf[-pre + 7] = (unsigned char)(len >> 16);
				buf[-pre + 8] = (unsigned char)(len >> 8);
				buf[-pre + 9] = (unsigned char)len;
			}
		}
		break;
	}

do_more_inside_frame:

	/*
	 * Deal with masking if we are in client -> server direction and
	 * the wp demands it
	 */

	if (masked7) {
		if (!wsi->ws->inside_frame)
			if (lws_0405_frame_mask_generate(wsi)) {
				lwsl_err("frame mask generation failed\n");
				return -1;
			}

		/*
		 * in v7, just mask the payload
		 */
		if (dropmask) { /* never set if already inside frame */
			for (n = 4; n < (int)len + 4; n++)
				dropmask[n] = dropmask[n] ^ wsi->ws->mask[
					(wsi->ws->mask_idx++) & 3];

			/* copy the frame nonce into place */
			memcpy(dropmask, wsi->ws->mask, 4);
		}
	}

	if (lwsi_role_h2_ENCAPSULATION(wsi)) {
		struct lws *encap = lws_get_network_wsi(wsi);

		assert(encap != wsi);
		return encap->role_ops->write_role_protocol(wsi, buf - pre,
							    len + pre, wp);
	}

	switch ((*wp) & 0x1f) {
	case LWS_WRITE_TEXT:
	case LWS_WRITE_BINARY:
	case LWS_WRITE_CONTINUATION:
		if (!wsi->h2_stream_carries_ws) {

			/*
			 * give any active extensions a chance to munge the
			 * buffer before send.  We pass in a pointer to an
			 * lws_tokens struct prepared with the default buffer
			 * and content length that's in there.  Rather than
			 * rewrite the default buffer, extensions that expect
			 * to grow the buffer can adapt .token to point to their
			 * own per-connection buffer in the extension user
			 * allocation.  By default with no extensions or no
			 * extension callback handling, just the normal input
			 * buffer is used then so it is efficient.
			 *
			 * callback returns 1 in case it wants to spill more
			 * buffers
			 *
			 * This takes care of holding the buffer if send is
			 * incomplete, ie, if wsi->ws->clean_buffer is 0
			 * (meaning an extension meddled with the buffer).  If
			 * wsi->ws->clean_buffer is 1, it will instead return
			 * to the user code how much OF THE USER BUFFER was
			 * consumed.
			 */

			n = lws_issue_raw_ext_access(wsi, buf - pre, len + pre);
			wsi->ws->inside_frame = 1;
			if (n <= 0)
				return n;

			if (n == (int)len + pre) {
				/* everything in the buffer was handled
				 * (or rebuffered...) */
				wsi->ws->inside_frame = 0;
				return (int)orig_len;
			}

			/*
			 * it is how many bytes of user buffer got sent... may
			 * be < orig_len in which case callback when writable
			 * has already been arranged and user code can call
			 * lws_write() again with the rest later.
			 */

			return n - pre;
		}
		break;
	default:
		break;
	}

send_raw:
	return lws_issue_raw(wsi, (unsigned char *)buf - pre, len + pre);
}